

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 ma_rb_pointer_distance(ma_rb *pRB)

{
  undefined1 local_70 [4];
  undefined1 local_6c [4];
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  ma_rb *pRB_local;
  undefined1 *local_48;
  undefined1 *local_40;
  uint local_34;
  ma_uint32 *local_30;
  ma_uint32 *local_28;
  uint local_1c;
  uint local_18;
  uint local_10;
  
  if (pRB == (ma_rb *)0x0) {
    pRB_local._4_4_ = 0;
  }
  else {
    readOffsetLoopFlag = pRB->encodedReadOffset;
    local_28 = &writeOffset;
    local_30 = &writeOffsetInBytes;
    _readOffsetInBytes = pRB;
    local_1c = readOffsetLoopFlag;
    if (local_28 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_30 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    writeOffsetLoopFlag = pRB->encodedWriteOffset;
    local_40 = local_6c;
    local_48 = local_70;
    local_34 = writeOffsetLoopFlag;
    local_18 = readOffsetLoopFlag;
    local_10 = readOffsetLoopFlag;
    if (local_40 == (undefined1 *)0x0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_48 == (undefined1 *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if ((readOffsetLoopFlag & 0x80000000) == (writeOffsetLoopFlag & 0x80000000)) {
      pRB_local._4_4_ = (writeOffsetLoopFlag & 0x7fffffff) - (readOffsetLoopFlag & 0x7fffffff);
    }
    else {
      pRB_local._4_4_ =
           (writeOffsetLoopFlag & 0x7fffffff) +
           (pRB->subbufferSizeInBytes - (readOffsetLoopFlag & 0x7fffffff));
    }
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_int32 ma_rb_pointer_distance(ma_rb* pRB)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;

    if (pRB == NULL) {
        return 0;
    }

    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        return writeOffsetInBytes - readOffsetInBytes;
    } else {
        return writeOffsetInBytes + (pRB->subbufferSizeInBytes - readOffsetInBytes);
    }
}